

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

void bcf_enc_vint(kstring_t *s,int n,int32_t *a,int wsize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  undefined2 uStack_38;
  int16_t x;
  int32_t x_1;
  
  if (n == 1) {
    bcf_enc_int1(s,*a);
    return;
  }
  if (n != 0) {
    uVar5 = 0;
    uVar7 = 0;
    if (0 < n) {
      uVar7 = (ulong)(uint)n;
    }
    iVar3 = 0x7fffffff;
    iVar4 = -0x7fffffff;
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      iVar1 = a[uVar5];
      iVar2 = iVar1;
      if (iVar1 < iVar4) {
        iVar2 = iVar4;
      }
      iVar6 = iVar1;
      if (iVar3 < iVar1) {
        iVar6 = iVar3;
      }
      if (-0x7fffffff < iVar1) {
        iVar3 = iVar6;
        iVar4 = iVar2;
      }
    }
    if (0 < wsize) {
      n = wsize;
    }
    if (iVar3 < -0x7e || 0x7f < iVar4) {
      _uStack_38 = in_RAX;
      if (iVar3 < -0x7ffe || 0x7fff < iVar4) {
        bcf_enc_size(s,n,3);
        for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          _uStack_38 = CONCAT44(a[uVar5],_uStack_38);
          kputsn((char *)&x_1,4,s);
        }
      }
      else {
        bcf_enc_size(s,n,2);
        for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          if (a[uVar5] == -0x7fffffff) {
            _uStack_38 = CONCAT22(0x8001,uStack_38);
          }
          else {
            _uStack_38 = CONCAT22((short)a[uVar5],uStack_38);
          }
          kputsn((char *)&x,2,s);
        }
      }
    }
    else {
      bcf_enc_size(s,n,1);
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        iVar4 = -0x7f;
        if (a[uVar5] != -0x7fffffff) {
          iVar4 = a[uVar5];
        }
        kputc(iVar4,s);
      }
    }
    return;
  }
  bcf_enc_size(s,0,0);
  return;
}

Assistant:

void bcf_enc_vint(kstring_t *s, int n, int32_t *a, int wsize)
{
    int32_t max = INT32_MIN + 1, min = INT32_MAX;
    int i;
    if (n == 0) bcf_enc_size(s, 0, BCF_BT_NULL);
    else if (n == 1) bcf_enc_int1(s, a[0]);
    else {
        if (wsize <= 0) wsize = n;
        for (i = 0; i < n; ++i) {
            if (a[i] == bcf_int32_missing || a[i] == bcf_int32_vector_end ) continue;
            if (max < a[i]) max = a[i];
            if (min > a[i]) min = a[i];
        }
        if (max <= INT8_MAX && min > bcf_int8_vector_end) {
            bcf_enc_size(s, wsize, BCF_BT_INT8);
            for (i = 0; i < n; ++i)
                if ( a[i]==bcf_int32_vector_end ) kputc(bcf_int8_vector_end, s);
                else if ( a[i]==bcf_int32_missing ) kputc(bcf_int8_missing, s);
                else kputc(a[i], s);
        } else if (max <= INT16_MAX && min > bcf_int16_vector_end) {
            bcf_enc_size(s, wsize, BCF_BT_INT16);
            for (i = 0; i < n; ++i)
            {
                int16_t x;
                if ( a[i]==bcf_int32_vector_end ) x = bcf_int16_vector_end;
                else if ( a[i]==bcf_int32_missing ) x = bcf_int16_missing;
                else x = a[i];
                kputsn((char*)&x, 2, s);
            }
        } else {
            bcf_enc_size(s, wsize, BCF_BT_INT32);
            for (i = 0; i < n; ++i) {
                int32_t x = a[i];
                kputsn((char*)&x, 4, s);
            }
        }
    }
}